

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Vec_Ptr_t * Gia_ManMiterNames(Vec_Ptr_t *p,int nOuts)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  char pBuffer [1000];
  char *local_428;
  char local_418 [1000];
  
  iVar7 = p->nSize;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < (iVar7 - nOuts / 2) - 1U) {
    iVar6 = iVar7 - nOuts / 2;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar6 << 3);
  }
  pVVar2->pArray = ppvVar3;
  if ((nOuts & 1U) != 0) {
    __assert_fail("nOuts % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xb57,"Vec_Ptr_t *Gia_ManMiterNames(Vec_Ptr_t *, int)");
  }
  if (iVar7 < nOuts) {
    __assert_fail("nOuts <= Vec_PtrSize(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xb58,"Vec_Ptr_t *Gia_ManMiterNames(Vec_Ptr_t *, int)");
  }
  uVar9 = 0;
  if ((nOuts != 0) && (1 < p->nSize)) {
    uVar8 = 0;
    do {
      sprintf(local_418,"%s_xor_%s",p->pArray[uVar8],p->pArray[uVar8 + 1]);
      sVar4 = strlen(local_418);
      pcVar5 = (char *)malloc(sVar4 + 1);
      strcpy(pcVar5,local_418);
      uVar11 = pVVar2->nSize;
      uVar1 = pVVar2->nCap;
      if (uVar11 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
          }
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar1 * 2;
          if (iVar7 <= (int)uVar1) goto LAB_001e9728;
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
          }
        }
        pVVar2->pArray = ppvVar3;
        pVVar2->nCap = iVar7;
      }
LAB_001e9728:
      pVVar2->nSize = uVar11 + 1;
      pVVar2->pArray[(int)uVar11] = pcVar5;
      uVar9 = uVar8 + 2;
    } while (((ulong)(uint)nOuts - 2 != uVar8) &&
            (iVar7 = (int)uVar8, uVar8 = uVar9, iVar7 + 3 < p->nSize));
  }
  if ((int)uVar9 < p->nSize) {
    lVar10 = (long)pVVar2->nSize;
    uVar11 = pVVar2->nCap;
    ppvVar3 = pVVar2->pArray;
    uVar9 = uVar9 & 0xffffffff;
    do {
      pcVar5 = (char *)p->pArray[uVar9];
      if (pcVar5 == (char *)0x0) {
        local_428 = (char *)0x0;
      }
      else {
        sVar4 = strlen(pcVar5);
        local_428 = (char *)malloc(sVar4 + 1);
        strcpy(local_428,pcVar5);
      }
      if ((uint)lVar10 == uVar11) {
        if ((int)uVar11 < 0x10) {
          if (ppvVar3 == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(ppvVar3,0x80);
          }
          uVar11 = 0x10;
        }
        else {
          uVar1 = uVar11 * 2;
          if (SBORROW4(uVar11,uVar1) != 0 < (int)uVar11) {
            uVar11 = uVar1;
            if (ppvVar3 == (void **)0x0) {
              ppvVar3 = (void **)malloc((ulong)uVar1 << 3);
            }
            else {
              ppvVar3 = (void **)realloc(ppvVar3,(ulong)uVar1 << 3);
            }
          }
        }
      }
      ppvVar3[lVar10] = local_428;
      lVar10 = lVar10 + 1;
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < p->nSize);
    pVVar2->nSize = (int)lVar10;
    pVVar2->nCap = uVar11;
    pVVar2->pArray = ppvVar3;
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Gia_ManMiterNames( Vec_Ptr_t * p, int nOuts )
{
    char * pName1, * pName2, pBuffer[1000]; int i;
    Vec_Ptr_t * pNew = Vec_PtrAlloc( Vec_PtrSize(p) - nOuts/2 );
    assert( nOuts % 2 == 0 );
    assert( nOuts <= Vec_PtrSize(p) );
    Vec_PtrForEachEntryDouble( char *, char *, p, pName1, pName2, i )
    {
        if ( i == nOuts )
            break;
        sprintf( pBuffer, "%s_xor_%s", pName1, pName2 );
        Vec_PtrPush( pNew, Abc_UtilStrsav(pBuffer) );
    }
    Vec_PtrForEachEntryStart( char *, p, pName1, i, i )
        Vec_PtrPush( pNew, Abc_UtilStrsav(pName1) );
    return pNew;
}